

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonehash.cpp
# Opt level: O3

void __thiscall
asmjit::ZoneHashBase::_rehash(ZoneHashBase *this,ZoneAllocator *allocator,uint32_t primeIndex)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ZoneHashNode **p;
  ZoneHashNode *pZVar4;
  Zone *pZVar5;
  ZoneHashNode *pZVar6;
  uint uVar7;
  ZoneHashNode **ppZVar8;
  Slot *pSVar9;
  uint8_t *extraout_RDX;
  ZoneAllocator *allocator_00;
  ZoneAllocator *this_00;
  uint uVar10;
  ulong uVar11;
  size_t sStack_38;
  
  if (primeIndex < 0x81) {
    allocator_00 = allocator;
    this_00 = (ZoneAllocator *)this;
    if (allocator->_zone == (Zone *)0x0) goto LAB_0012327b;
    uVar11 = (ulong)primeIndex;
    uVar7 = *(uint *)(ZoneHash_primeArray + uVar11 * 8);
    p = this->_data;
    allocator_00 = (ZoneAllocator *)((ulong)uVar7 * 8);
    ppZVar8 = (ZoneHashNode **)
              ZoneAllocator::_allocZeroed(allocator,(size_t)allocator_00,&sStack_38);
    if (ppZVar8 == (ZoneHashNode **)0x0) {
      return;
    }
    uVar2 = this->_bucketsCount;
    this_00 = (ZoneAllocator *)(ulong)uVar2;
    this->_data = ppZVar8;
    this->_bucketsCount = uVar7;
    this->_bucketsGrow = (uint32_t)(long)((double)uVar7 * 0.9);
    uVar3 = *(uint *)(ZoneHash_primeArray + uVar11 * 8 + 4);
    this->_rcpValue = uVar3;
    bVar1 = ZoneHash_primeShift[uVar11];
    this->_rcpShift = bVar1;
    this->_primeIndex = (uint8_t)primeIndex;
    if (this_00 != (ZoneAllocator *)0x0) {
      allocator_00 = (ZoneAllocator *)0x0;
      do {
        pZVar6 = p[(long)allocator_00];
        while (pZVar6 != (ZoneHashNode *)0x0) {
          pZVar4 = *(ZoneHashNode **)pZVar6;
          uVar10 = *(uint *)(pZVar6 + 8) -
                   (int)((ulong)*(uint *)(pZVar6 + 8) * (ulong)uVar3 >> (bVar1 & 0x3f)) * uVar7;
          *(ZoneHashNode **)pZVar6 = ppZVar8[uVar10];
          ppZVar8[uVar10] = pZVar6;
          pZVar6 = pZVar4;
        }
        allocator_00 = (ZoneAllocator *)((long)&allocator_00->_zone + 1);
      } while (allocator_00 != this_00);
    }
    if (p == this->_embedded) {
      return;
    }
    if (allocator->_zone == (Zone *)0x0) goto LAB_00123280;
    if (p != (ZoneHashNode **)0x0) {
      if (this_00 != (ZoneAllocator *)0x0) {
        if (0x40 < uVar2) {
          ZoneAllocator::_releaseDynamic(allocator,p,(long)this_00 * 8);
          return;
        }
        _rehash();
        return;
      }
      goto LAB_0012328a;
    }
  }
  else {
    _rehash();
    allocator_00 = allocator;
    this_00 = (ZoneAllocator *)this;
LAB_0012327b:
    _rehash();
LAB_00123280:
    _rehash();
  }
  _rehash();
LAB_0012328a:
  _rehash();
  uVar7 = *(uint *)(extraout_RDX + 8) -
          (int)((ulong)*(uint *)(this_00->_slots + 2) * (ulong)*(uint *)(extraout_RDX + 8) >>
               (*(byte *)((long)this_00->_slots + 0x14) & 0x3f)) * *(int *)(this_00->_slots + 1);
  pZVar5 = this_00->_zone;
  *(uint8_t **)extraout_RDX = (&pZVar5->_ptr)[uVar7];
  (&pZVar5->_ptr)[uVar7] = extraout_RDX;
  pSVar9 = (Slot *)((long)&this_00->_slots[0]->next + 1);
  this_00->_slots[0] = pSVar9;
  if ((Slot *)(ulong)*(uint *)((long)this_00->_slots + 0xc) < pSVar9) {
    bVar1 = *(byte *)((long)this_00->_slots + 0x15);
    uVar7 = 0x7e;
    if (bVar1 < 0x7e) {
      uVar7 = (uint)bVar1;
    }
    if ((uint)bVar1 < uVar7 + 2) {
      _rehash((ZoneHashBase *)this_00,allocator_00,uVar7 + 2);
    }
  }
  return;
}

Assistant:

void ZoneHashBase::_rehash(ZoneAllocator* allocator, uint32_t primeIndex) noexcept {
  ASMJIT_ASSERT(primeIndex < ASMJIT_ARRAY_SIZE(ZoneHash_primeArray));
  uint32_t newCount = ZoneHash_primeArray[primeIndex].prime;

  ZoneHashNode** oldData = _data;
  ZoneHashNode** newData = reinterpret_cast<ZoneHashNode**>(
    allocator->allocZeroed(size_t(newCount) * sizeof(ZoneHashNode*)));

  // We can still store nodes into the table, but it will degrade.
  if (ASMJIT_UNLIKELY(newData == nullptr))
    return;

  uint32_t i;
  uint32_t oldCount = _bucketsCount;

  _data = newData;
  _bucketsCount = newCount;
  _bucketsGrow = uint32_t(newCount * 0.9);
  _rcpValue = ZoneHash_primeArray[primeIndex].rcp;
  _rcpShift = ZoneHash_primeShift[primeIndex];
  _primeIndex = uint8_t(primeIndex);

  for (i = 0; i < oldCount; i++) {
    ZoneHashNode* node = oldData[i];
    while (node) {
      ZoneHashNode* next = node->_hashNext;
      uint32_t hashMod = _calcMod(node->_hashCode);

      node->_hashNext = newData[hashMod];
      newData[hashMod] = node;
      node = next;
    }
  }

  if (oldData != _embedded)
    allocator->release(oldData, oldCount * sizeof(ZoneHashNode*));
}